

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::AddSettingsHandler(ImGuiSettingsHandler *handler)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  iVar4 = (GImGui->SettingsHandlers).Size;
  if (iVar4 == (GImGui->SettingsHandlers).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiSettingsHandler *)
             (*GImAllocatorAllocFunc)((long)iVar6 * 0x48,GImAllocatorUserData);
    pIVar2 = (pIVar3->SettingsHandlers).Data;
    if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar3->SettingsHandlers).Size * 0x48);
      pIVar2 = (pIVar3->SettingsHandlers).Data;
      if ((pIVar2 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar3->SettingsHandlers).Data = __dest;
    (pIVar3->SettingsHandlers).Capacity = iVar6;
    iVar4 = (pIVar3->SettingsHandlers).Size;
  }
  else {
    __dest = (GImGui->SettingsHandlers).Data;
  }
  memcpy(__dest + iVar4,handler,0x48);
  (pIVar3->SettingsHandlers).Size = (pIVar3->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::AddSettingsHandler(const ImGuiSettingsHandler* handler)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(FindSettingsHandler(handler->TypeName) == NULL);
    g.SettingsHandlers.push_back(*handler);
}